

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

Result __thiscall
presolve::HPresolve::singletonCol(HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt col)

{
  double val;
  int iVar1;
  int row;
  bool bVar2;
  Result RVar3;
  Result RVar4;
  
  iVar1 = (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  row = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar1];
  if ((this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[row] == 1) {
    RVar3 = singletonRow(this,postsolve_stack,row);
    if ((RVar3 == kOk) &&
       (RVar3 = kOk,
       (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start[col] == '\0')) {
      RVar3 = emptyCol(this,postsolve_stack,col);
      return RVar3;
    }
  }
  else {
    val = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar1];
    RVar4 = kOk;
    RVar3 = detectDominatedCol(this,postsolve_stack,col,false);
    if ((RVar3 == kOk) &&
       (RVar3 = kOk,
       (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start[col] == '\0')) {
      if (this->mipsolver != (HighsMipSolver *)0x0) {
        convertImpliedInteger(this,col,row,false);
      }
      updateColImpliedBounds(this,row,col,val);
      if ((this->model->integrality_).
          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_start[col] != kInteger) {
        updateRowDualImpliedBounds(this,row,col,val);
      }
      bVar2 = isDualImpliedFree(this,row);
      RVar3 = RVar4;
      if ((((bVar2) && (bVar2 = isImpliedFree(this,col), bVar2)) &&
          ((*(this->analysis_).allow_rule_.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 0x100) != 0)) &&
         (((this->model->integrality_).
           super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
           super__Vector_impl_data._M_start[col] != kInteger ||
          (bVar2 = isImpliedIntegral(this,col), bVar2)))) {
        bVar2 = (this->analysis_).logging_on_;
        if (bVar2 == true) {
          HPresolveAnalysis::startPresolveRuleLog(&this->analysis_,8);
          getRowPositions(this,row,&this->rowpositions);
          substituteFreeCol(this,postsolve_stack,row,col,false);
          (this->analysis_).logging_on_ = true;
          HPresolveAnalysis::stopPresolveRuleLog(&this->analysis_,8);
        }
        else {
          getRowPositions(this,row,&this->rowpositions);
          substituteFreeCol(this,postsolve_stack,row,col,false);
          (this->analysis_).logging_on_ = bVar2;
        }
        RVar3 = checkLimits(this,postsolve_stack);
        return RVar3;
      }
    }
  }
  return RVar3;
}

Assistant:

HPresolve::Result HPresolve::singletonCol(HighsPostsolveStack& postsolve_stack,
                                          HighsInt col) {
  assert(colsize[col] == 1);
  assert(!colDeleted[col]);
  HighsInt nzPos = colhead[col];
  HighsInt row = Arow[nzPos];
  double colCoef = Avalue[nzPos];

  if (rowsize[row] == 1) {
    HPRESOLVE_CHECKED_CALL(singletonRow(postsolve_stack, row););

    if (!colDeleted[col]) {
      assert(colsize[col] == 0);
      return emptyCol(postsolve_stack, col);
    }
    return Result::kOk;
  }

  // detect strong / weak domination
  HPRESOLVE_CHECKED_CALL(detectDominatedCol(postsolve_stack, col, false));
  if (colDeleted[col]) return Result::kOk;

  if (mipsolver != nullptr) convertImpliedInteger(col, row);

  updateColImpliedBounds(row, col, colCoef);

  if (model->integrality_[col] != HighsVarType::kInteger)
    updateRowDualImpliedBounds(row, col, colCoef);

  // now check if column is implied free within an equation and substitute the
  // column if that is the case
  if (isDualImpliedFree(row) && isImpliedFree(col) &&
      analysis_.allow_rule_[kPresolveRuleFreeColSubstitution]) {
    if (model->integrality_[col] == HighsVarType::kInteger &&
        !isImpliedIntegral(col))
      return Result::kOk;

    const bool logging_on = analysis_.logging_on_;

    if (logging_on)
      analysis_.startPresolveRuleLog(kPresolveRuleFreeColSubstitution);

    // todo, store which side of an implied free dual variable needs to be used
    // for substitution
    storeRow(row);

    substituteFreeCol(postsolve_stack, row, col);

    analysis_.logging_on_ = logging_on;
    if (logging_on)
      analysis_.stopPresolveRuleLog(kPresolveRuleFreeColSubstitution);
    return checkLimits(postsolve_stack);
  }

  // todo: check for zero cost singleton and remove
  return Result::kOk;
}